

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

optional<unsigned_int> __thiscall
slang::ast::ConversionExpression::getEffectiveWidthImpl(ConversionExpression *this)

{
  _Optional_payload_base<unsigned_int> _Var1;
  ulong uVar2;
  
  if ((int)this->conversionKind < 2) {
    _Var1 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this->operand_);
    uVar2 = (ulong)_Var1 & 0xffffffff00000000;
  }
  else {
    _Var1._M_payload = Type::getBitWidth((this->super_Expression).type.ptr);
    _Var1._4_4_ = 0;
    uVar2 = 0x100000000;
  }
  return (optional<unsigned_int>)((ulong)_Var1 & 0xffffffff | uVar2);
}

Assistant:

std::optional<bitwidth_t> ConversionExpression::getEffectiveWidthImpl() const {
    if (isImplicit())
        return operand().getEffectiveWidth();
    return type->getBitWidth();
}